

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O3

void __thiscall
LowererMD::EmitLoadVarNoCheck
          (LowererMD *this,RegOpnd *dst,RegOpnd *src,Instr *instrLoad,bool isFromUint32,
          bool isHelper)

{
  RegOpnd *opndFloat;
  Instr *pIVar1;
  undefined7 in_register_00000081;
  
  opndFloat = IR::RegOpnd::New(TyFloat64,this->m_func);
  pIVar1 = instrLoad;
  if ((int)CONCAT71(in_register_00000081,isFromUint32) == 0) {
    LowererMDArch::EmitIntToFloat
              (&this->lowererMDArch,&opndFloat->super_Opnd,&src->super_Opnd,instrLoad);
  }
  else {
    LowererMDArch::EmitUIntToFloat
              (&this->lowererMDArch,&opndFloat->super_Opnd,&src->super_Opnd,instrLoad);
  }
  SaveDoubleToVar(this,dst,opndFloat,pIVar1,instrLoad,isHelper);
  return;
}

Assistant:

void
LowererMD::EmitLoadVarNoCheck(IR::RegOpnd * dst, IR::RegOpnd * src, IR::Instr *instrLoad, bool isFromUint32, bool isHelper)
{
#ifdef _M_IX86
    if (!AutoSystemInfo::Data.SSE2Available())
    {
        IR::JnHelperMethod helperMethod;

        // PUSH &floatTemp
        IR::Opnd *tempOpnd;
        if (instrLoad->dstIsTempNumber)
        {
            helperMethod = isFromUint32 ? IR::HelperOp_UInt32ToAtomInPlace : IR::HelperOp_Int32ToAtomInPlace;

            // Use the original dst to get the temp number sym
            StackSym * tempNumberSym = this->m_lowerer->GetTempNumberSym(instrLoad->GetDst(), instrLoad->dstIsTempNumberTransferred);

            IR::Instr *load = this->m_lowerer->InsertLoadStackAddress(tempNumberSym, instrLoad);
            tempOpnd = load->GetDst();
            this->LoadHelperArgument(instrLoad, tempOpnd);
        }
        else
        {
            helperMethod = isFromUint32 ? IR::HelperOp_UInt32ToAtom : IR::HelperOp_Int32ToAtom;
        }
        //      PUSH memContext
        this->m_lowerer->LoadScriptContext(instrLoad);

        //      PUSH s1
        this->LoadHelperArgument(instrLoad, src);

        // dst = ToVar()
        IR::Instr * instr = IR::Instr::New(Js::OpCode::Call, dst,
            IR::HelperCallOpnd::New(helperMethod, this->m_func), this->m_func);
        instrLoad->InsertBefore(instr);
        this->LowerCall(instr, 0);
        return;
    }
#endif

    IR::RegOpnd * floatReg = IR::RegOpnd::New(TyFloat64, this->m_func);
    if (isFromUint32)
    {
        this->EmitUIntToFloat(floatReg, src, instrLoad);
    }
    else
    {
        this->EmitIntToFloat(floatReg, src, instrLoad);
    }
    this->SaveDoubleToVar(dst, floatReg, instrLoad, instrLoad, isHelper);
}